

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void vgatherqd_(PDISASM pMyDisasm)

{
  Int32 IVar1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
      if ((((pMyDisasm->Reserved_).REX.W_ == '\0') && ((pMyDisasm->Reserved_).EVEX.state != '\x01'))
         || (((pMyDisasm->Reserved_).EVEX.state == '\x01' && ((pMyDisasm->Reserved_).EVEX.W == '\0')
             ))) {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpgatherqd");
        (pMyDisasm->Reserved_).EVEX.masking = '\x01';
        if ((pMyDisasm->Reserved_).VEX.L == '\0') {
          IVar1 = 0x110000;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            IVar1 = 0x140000;
          }
          (pMyDisasm->Instruction).Category = IVar1;
          (pMyDisasm->Reserved_).VSIB_ = 4;
          (pMyDisasm->Reserved_).Register_ = 4;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxEx(pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxExVEX(pMyDisasm);
            (pMyDisasm->Operand1).AccessMode = 3;
            (pMyDisasm->Operand3).AccessMode = 3;
          }
        }
        else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
          IVar1 = 0x120000;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            IVar1 = 0x140000;
          }
          (pMyDisasm->Instruction).Category = IVar1;
          (pMyDisasm->Reserved_).VSIB_ = 8;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            (pMyDisasm->Reserved_).Register_ = 8;
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxEx(pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).Register_ = 8;
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxExVEX(pMyDisasm);
            (pMyDisasm->Operand1).AccessMode = 3;
            (pMyDisasm->Operand3).AccessMode = 3;
          }
        }
        else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
          (pMyDisasm->Instruction).Category = 0x140000;
          (pMyDisasm->Reserved_).VSIB_ = 0x10;
          (pMyDisasm->Reserved_).Register_ = 0x10;
          (pMyDisasm->Reserved_).MemDecoration = 0x68;
          GxEx(pMyDisasm);
        }
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vpgatherqq");
        (pMyDisasm->Reserved_).EVEX.masking = '\x01';
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        if ((pMyDisasm->Reserved_).VEX.L == '\0') {
          IVar1 = 0x110000;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            IVar1 = 0x140000;
          }
          (pMyDisasm->Instruction).Category = IVar1;
          (pMyDisasm->Reserved_).VSIB_ = 4;
          (pMyDisasm->Reserved_).Register_ = 4;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            GxEx(pMyDisasm);
          }
          else {
            GxExVEX(pMyDisasm);
            (pMyDisasm->Operand1).AccessMode = 3;
            (pMyDisasm->Operand3).AccessMode = 3;
          }
        }
        else if ((pMyDisasm->Reserved_).VEX.L == '\x01') {
          IVar1 = 0x120000;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            IVar1 = 0x140000;
          }
          (pMyDisasm->Instruction).Category = IVar1;
          (pMyDisasm->Reserved_).VSIB_ = 8;
          (pMyDisasm->Reserved_).Register_ = 8;
          if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxEx(pMyDisasm);
          }
          else {
            (pMyDisasm->Reserved_).MemDecoration = 0x68;
            GxExVEX(pMyDisasm);
            (pMyDisasm->Operand1).AccessMode = 3;
            (pMyDisasm->Operand3).AccessMode = 3;
          }
        }
        else if ((pMyDisasm->Reserved_).EVEX.LL == '\x02') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x06';
          (pMyDisasm->Instruction).Category = 0x140000;
          (pMyDisasm->Reserved_).VSIB_ = 0x10;
          (pMyDisasm->Reserved_).Register_ = 0x10;
          (pMyDisasm->Reserved_).MemDecoration = 0x68;
          GxEx(pMyDisasm);
        }
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else {
    failDecode(pMyDisasm);
  }
  return;
}

Assistant:

void __bea_callspec__ vgatherqd_(PDISASM pMyDisasm)
{
 /* ========== 0x66 */
 if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
   GV.OperandSize = GV.OriginalOperandSize;
   pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
   if (GV.VEX.state == InUsePrefix) {
     if (
         ((GV.REX.W_ == 0x0) && (GV.EVEX.state != InUsePrefix)) ||
         ((GV.EVEX.state == InUsePrefix) && (GV.EVEX.W == 0))
       ) {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpgatherqd");
       #endif
       GV.EVEX.masking = MERGING;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;

         if (GV.EVEX.state != InUsePrefix) {
           GV.Register_ = AVX_REG;
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;
         }
         else {
           GV.Register_ = AVX_REG;
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }
       }
       else if (GV.EVEX.LL == 0x2) {
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX512_REG;
         GV.MemDecoration = Arg2qword;
         GxEx(pMyDisasm);

       }

     } else {
       #ifndef BEA_LIGHT_DISASSEMBLY
          (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vpgatherqq");
       #endif
       GV.EVEX.masking = MERGING;
       GV.MemDecoration = Arg2qword;
       if (GV.VEX.L == 0) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX_INSTRUCTION;
         GV.VSIB_ = SSE_REG;
         GV.Register_ = SSE_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;

         }
         else {
           GxEx(pMyDisasm);
         }

       }
       else if (GV.VEX.L == 0x1) {
         pMyDisasm->Instruction.Category = (GV.EVEX.state == InUsePrefix) ? AVX512_INSTRUCTION : AVX2_INSTRUCTION;
         GV.VSIB_ = AVX_REG;
         GV.Register_ = AVX_REG;
         if (GV.EVEX.state != InUsePrefix) {
           GV.MemDecoration = Arg2qword;
           GxExVEX(pMyDisasm);
           pMyDisasm->Operand1.AccessMode = READ + WRITE;
           pMyDisasm->Operand3.AccessMode = READ + WRITE;

         }
         else {
           GV.MemDecoration = Arg2qword;
           GxEx(pMyDisasm);
         }

       }
       else if (GV.EVEX.LL == 0x2) {
         GV.EVEX.tupletype = TUPLE1_SCALAR;
         pMyDisasm->Instruction.Category = AVX512_INSTRUCTION;
         GV.VSIB_ = AVX512_REG;
         GV.Register_ = AVX512_REG;
         GV.MemDecoration = Arg2qword;
         GxEx(pMyDisasm);

       }
     }
   } else {
     failDecode(pMyDisasm);
   }
 }
 else {
   failDecode(pMyDisasm);
 }
}